

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addMemberDecoration(Builder *this,Id id,uint member,Decoration decoration,int num)

{
  Instruction *this_00;
  undefined4 in_register_00000034;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40 [3];
  Instruction *local_28;
  Instruction *dec;
  int num_local;
  Decoration decoration_local;
  uint member_local;
  Id id_local;
  Builder *this_local;
  
  dec._0_4_ = num;
  dec._4_4_ = decoration;
  num_local = member;
  decoration_local = id;
  _member_local = this;
  this_00 = (Instruction *)
            Instruction::operator_new((Instruction *)0x38,CONCAT44(in_register_00000034,id));
  Instruction::Instruction(this_00,OpMemberDecorate);
  local_28 = this_00;
  Instruction::addIdOperand(this_00,decoration_local);
  Instruction::addImmediateOperand(local_28,num_local);
  Instruction::addImmediateOperand(local_28,dec._4_4_);
  if (-1 < (int)(uint)dec) {
    Instruction::addImmediateOperand(local_28,(uint)dec);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)local_40,local_28
            );
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->decorations,(value_type *)local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(local_40);
  return;
}

Assistant:

void Builder::addMemberDecoration(Id id, unsigned int member, Decoration decoration, int num)
{
    Instruction* dec = new Instruction(OpMemberDecorate);
    dec->addIdOperand(id);
    dec->addImmediateOperand(member);
    dec->addImmediateOperand(decoration);
    if (num >= 0)
        dec->addImmediateOperand(num);

    decorations.push_back(std::unique_ptr<Instruction>(dec));
}